

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

double Extra_Power2(int Degree)

{
  bool bVar1;
  double dVar2;
  
  if (-1 < Degree) {
    if ((uint)Degree < 0x20) {
      dVar2 = (double)(1 << ((byte)Degree & 0x1f));
    }
    else {
      dVar2 = 1.0;
      while (bVar1 = Degree != 0, Degree = Degree + -1, bVar1) {
        dVar2 = dVar2 + dVar2;
      }
    }
    return dVar2;
  }
  __assert_fail("Degree >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                ,0x65,"double Extra_Power2(int)");
}

Assistant:

double Extra_Power2( int Degree )
{
    double Res;
    assert( Degree >= 0 );
    if ( Degree < 32 )
        return (double)(01<<Degree); 
    for ( Res = 1.0; Degree; Res *= 2.0, Degree-- );
    return Res;
}